

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O0

int __thiscall
asmjit::CodeBuilder::bind(CodeBuilder *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Error EVar1;
  undefined4 in_register_00000034;
  CodeEmitter *this_00;
  CodeBuilder *unaff_retaddr;
  Error err;
  CBLabel *node;
  uint in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  Error in_stack_ffffffffffffffc4;
  Error local_24;
  
  this_00 = (CodeEmitter *)CONCAT44(in_register_00000034,__fd);
  if ((this->super_CodeEmitter)._lastError == 0) {
    EVar1 = getCBLabel(unaff_retaddr,(CBLabel **)this_00,(uint32_t)((ulong)this >> 0x20));
    if (EVar1 == 0) {
      addNode((CodeBuilder *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
              (CBNode *)(ulong)in_stack_ffffffffffffffb8);
      local_24 = 0;
    }
    else {
      local_24 = CodeEmitter::setLastError
                           (this_00,in_stack_ffffffffffffffc4,
                            (char *)CONCAT44(EVar1,in_stack_ffffffffffffffb8));
    }
  }
  else {
    local_24 = (this->super_CodeEmitter)._lastError;
  }
  return local_24;
}

Assistant:

Error CodeBuilder::bind(const Label& label) {
  if (_lastError) return _lastError;

  CBLabel* node;
  Error err = getCBLabel(&node, label);
  if (ASMJIT_UNLIKELY(err))
    return setLastError(err);

  addNode(node);
  return kErrorOk;
}